

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

char * __thiscall
duckdb::StrfTimeFormat::WritePadded(StrfTimeFormat *this,char *target,uint32_t value,size_t padding)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = value;
  if ((padding & 1) != 0) {
    uVar1 = value / 1000;
    WritePadded3(this,target + (padding - 3),value % 1000);
    padding = padding - 3;
  }
  if (1 < padding) {
    lVar2 = 0;
    do {
      *(undefined2 *)(target + lVar2 * 2 + (padding - 2)) =
           *(undefined2 *)
            (duckdb_fmt::v6::internal::basic_data<void>::digits + (ulong)(uVar1 % 100) * 2);
      lVar2 = lVar2 + -1;
      uVar1 = uVar1 / 100;
    } while (-lVar2 != padding >> 1);
  }
  return target + padding;
}

Assistant:

char *StrfTimeFormat::WritePadded(char *target, uint32_t value, size_t padding) const {
	D_ASSERT(padding > 1);
	if (padding % 2) {
		uint32_t decimals = value % 1000u;
		WritePadded3(target + padding - 3, decimals);
		value /= 1000;
		padding -= 3;
	}
	for (size_t i = 0; i < padding / 2; i++) {
		uint32_t decimals = value % 100u;
		WritePadded2(target + padding - 2 * (i + 1), decimals);
		value /= 100;
	}
	return target + padding;
}